

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O2

void __thiscall
gulcalc::writemode0output
          (gulcalc *this,item_map_rec *er,OASIS_FLOAT tiv,int event_id,int bin_index,
          OASIS_FLOAT rval,probrec *p,int sample_id,bool correlated)

{
  int iVar1;
  pointer pdVar2;
  int iVar3;
  double dVar4;
  damagebindictionary b;
  gulcoverageSampleslevel ggc;
  gulitemSampleslevel local_90;
  gulGulSamples local_80;
  damagebindictionary local_58;
  gulcoverageSampleslevel local_38;
  
  iVar1 = er->item_id;
  local_80.prob_from = p->prob_from;
  local_80.prob_to = p->prob_to;
  local_80.bin_mean = p->bin_mean;
  dVar4 = (double)rval;
  iVar3 = sample_id + 1;
  pdVar2 = (this->damagebindictionary_vec_->
           super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_58.interval_type = pdVar2[bin_index].interval_type;
  pdVar2 = pdVar2 + bin_index;
  local_58.bin_index = pdVar2->bin_index;
  local_58.bin_from = pdVar2->bin_from;
  local_58.bin_to = pdVar2->bin_to;
  local_58.interpolation = pdVar2->interpolation;
  local_80.event_id = event_id;
  local_80.item_id = iVar1;
  local_80.tiv = tiv;
  local_80.bin_index = bin_index;
  local_80.sidx = iVar3;
  local_80.rval = dVar4;
  if (this->debug_ == false) {
    rval = getgul(this,&local_58,&local_80);
    dVar4 = (double)rval;
  }
  if (this->loss_threshold_ <= dVar4) {
    local_90.event_id = event_id;
    local_90.item_id = iVar1;
    local_90.sidx = iVar3;
    local_90.loss = rval;
    if (correlated) {
      correlatedoutputgul(this,&local_90);
    }
    else {
      itemoutputgul(this,&local_90);
    }
    if (this->correlatedWriter_ == (_func_void_void_ptr_int_int *)0x0) {
      local_38.coverage_id = er->coverage_id;
      local_38.event_id = event_id;
      local_38.sidx = iVar3;
      local_38.loss = rval;
      gencovoutput(this,&local_38);
    }
  }
  return;
}

Assistant:

void gulcalc::writemode0output(const item_map_rec &er, const OASIS_FLOAT tiv,
			       const int event_id, const int bin_index,
			       const OASIS_FLOAT rval, const probrec &p,
			       const int sample_id,
			       const bool correlated=false) {

	gulGulSamples g;
	g.event_id = event_id;
	g.item_id = er.item_id;
	g.tiv = tiv;
	g.bin_index = bin_index;
	g.prob_from = p.prob_from;
	g.prob_to = p.prob_to;
	g.bin_mean = p.bin_mean;
	g.rval = rval;
	g.sidx = sample_id + 1;

	gulitemSampleslevel gg;
	damagebindictionary b = (*damagebindictionary_vec_)[g.bin_index];
	if (debug_) gg.loss = rval;
	else gg.loss = getgul(b, g);

	gg.sidx = g.sidx;
	gg.event_id = g.event_id;
	gg.item_id = g.item_id;
	if (gg.loss >= loss_threshold_) {

		if (correlated) correlatedoutputgul(gg);
		else itemoutputgul(gg);

		if (!correlatedWriter_) {
			gulcoverageSampleslevel ggc;
			ggc.loss = gg.loss;
			ggc.sidx = g.sidx;
			ggc.coverage_id = er.coverage_id;
			ggc.event_id = g.event_id;
			gencovoutput(ggc);
		}

	}

}